

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

bool __thiscall Rml::DataViewChecked::Update(DataViewChecked *this,DataModel *model)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  Element *element_00;
  DataExpression *this_00;
  Type TVar4;
  __type local_201;
  allocator<char> local_1c1;
  String local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  allocator<char> local_179;
  String local_178;
  allocator<char> local_151;
  String local_150;
  undefined1 local_12d;
  byte local_12c;
  byte local_12b;
  byte local_12a;
  allocator<char> local_129;
  undefined1 local_128 [3];
  bool current_checked_state;
  byte local_103;
  byte local_102;
  allocator<char> local_101;
  String local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  String value;
  undefined1 local_78 [7];
  bool new_checked_state;
  DataExpressionInterface expr_interface;
  Element *element;
  Variant variant;
  bool result;
  DataModel *model_local;
  DataViewChecked *this_local;
  
  variant.data[0x1f] = '\0';
  Variant::Variant((Variant *)&element);
  element_00 = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface
            ((DataExpressionInterface *)local_78,model,element_00,(Event *)0x0);
  if (element_00 != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar2 = DataExpression::Run(this_00,(DataExpressionInterface *)local_78,(Variant *)&element);
    if (bVar2) {
      value.field_2._M_local_buf[0xf] = '\0';
      TVar4 = Variant::GetType((Variant *)&element);
      if (TVar4 == BOOL) {
        value.field_2._M_local_buf[0xf] = Variant::Get<bool>((Variant *)&element,false);
      }
      else {
        ::std::__cxx11::string::string((string *)&local_c0);
        Variant::Get<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   (Variant *)&element,&local_c0);
        ::std::__cxx11::string::~string((string *)&local_c0);
        uVar3 = ::std::__cxx11::string::empty();
        local_102 = 0;
        local_103 = 0;
        local_12a = 0;
        local_12b = 0;
        local_12c = 0;
        local_201 = false;
        if ((uVar3 & 1) == 0) {
          ::std::allocator<char>::allocator();
          local_102 = 1;
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,"value",&local_101);
          local_103 = 1;
          ::std::allocator<char>::allocator();
          local_12a = 1;
          ::std::__cxx11::string::string<std::allocator<char>>((string *)local_128,"",&local_129);
          local_12b = 1;
          Element::GetAttribute<std::__cxx11::string>
                    (&local_e0,element_00,&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128)
          ;
          local_12c = 1;
          local_201 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_a0,&local_e0);
        }
        value.field_2._M_local_buf[0xf] = local_201;
        if ((local_12c & 1) != 0) {
          ::std::__cxx11::string::~string((string *)&local_e0);
        }
        if ((local_12b & 1) != 0) {
          ::std::__cxx11::string::~string((string *)local_128);
        }
        if ((local_12a & 1) != 0) {
          ::std::allocator<char>::~allocator(&local_129);
        }
        if ((local_103 & 1) != 0) {
          ::std::__cxx11::string::~string((string *)&local_100);
        }
        if ((local_102 & 1) != 0) {
          ::std::allocator<char>::~allocator(&local_101);
        }
        ::std::__cxx11::string::~string((string *)local_a0);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"checked",&local_151);
      bVar2 = Element::HasAttribute(element_00,&local_150);
      ::std::__cxx11::string::~string((string *)&local_150);
      ::std::allocator<char>::~allocator(&local_151);
      local_12d = bVar2;
      if ((bool)(value.field_2._M_local_buf[0xf] & 1U) != bVar2) {
        variant.data[0x1f] = '\x01';
        if ((value.field_2._M_local_buf[0xf] & 1U) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c0,"checked",&local_1c1);
          Element::RemoveAttribute(element_00,&local_1c0);
          ::std::__cxx11::string::~string((string *)&local_1c0);
          ::std::allocator<char>::~allocator(&local_1c1);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_178,"checked",&local_179);
          ::std::__cxx11::string::string((string *)&local_1a0);
          Element::SetAttribute<std::__cxx11::string>(element_00,&local_178,&local_1a0);
          ::std::__cxx11::string::~string((string *)&local_1a0);
          ::std::__cxx11::string::~string((string *)&local_178);
          ::std::allocator<char>::~allocator(&local_179);
        }
      }
    }
  }
  cVar1 = variant.data[0x1f];
  Variant::~Variant((Variant *)&element);
  return (bool)(cVar1 & 1);
}

Assistant:

bool DataViewChecked::Update(DataModel& model)
{
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		bool new_checked_state = false;

		if (variant.GetType() == Variant::BOOL)
		{
			new_checked_state = variant.Get<bool>();
		}
		else
		{
			const String value = variant.Get<String>();
			new_checked_state = (!value.empty() && value == element->GetAttribute<String>("value", ""));
		}

		const bool current_checked_state = element->HasAttribute("checked");

		if (new_checked_state != current_checked_state)
		{
			result = true;
			if (new_checked_state)
				element->SetAttribute("checked", String());
			else
				element->RemoveAttribute("checked");
		}
	}

	return result;
}